

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O3

Colourb Rml::InterpolateColour(Colourb c0,Colourb c1,float alpha)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar4 = (float)((uint)c0 & 0xff) / 255.0;
  fVar5 = (float)((uint)c0 >> 8 & 0xff) / 255.0;
  fVar6 = (float)((uint)c0 >> 0x10 & 0xff) / 255.0;
  fVar2 = (float)((uint)c1 & 0xff) / 255.0;
  fVar8 = (float)((uint)c1 >> 8 & 0xff) / 255.0;
  fVar9 = (float)((uint)c1 >> 0x10 & 0xff) / 255.0;
  fVar7 = 1.0 - alpha;
  auVar3._0_4_ = (float)((uint)c0 >> 0x18);
  auVar3._4_4_ = (float)((uint)c1 >> 0x18);
  auVar3._8_8_ = 0;
  auVar3 = divps(auVar3,_DAT_002d3950);
  fVar4 = Math::SquareRoot(fVar2 * fVar2 * alpha + fVar4 * fVar4 * fVar7);
  fVar4 = fVar4 * 255.0;
  fVar2 = 255.0;
  if (fVar4 <= 255.0) {
    fVar2 = fVar4;
  }
  fVar8 = Math::SquareRoot(fVar8 * fVar8 * alpha + fVar5 * fVar5 * fVar7);
  fVar8 = fVar8 * 255.0;
  fVar5 = 255.0;
  if (fVar8 <= 255.0) {
    fVar5 = fVar8;
  }
  fVar9 = Math::SquareRoot(fVar9 * fVar9 * alpha + fVar6 * fVar6 * fVar7);
  fVar9 = fVar9 * 255.0;
  fVar6 = 255.0;
  if (fVar9 <= 255.0) {
    fVar6 = fVar9;
  }
  fVar1 = (alpha * auVar3._4_4_ + fVar7 * auVar3._0_4_) * 255.0;
  fVar7 = 255.0;
  if (fVar1 <= 255.0) {
    fVar7 = fVar1;
  }
  return (Colourb)((int)(float)(~-(uint)(fVar4 < 0.0) & (uint)fVar2) & 0xffU |
                  ((int)(float)(~-(uint)(fVar8 < 0.0) & (uint)fVar5) & 0xffU) << 8 |
                  ((int)(float)(~-(uint)(fVar9 < 0.0) & (uint)fVar6) & 0xffU) << 0x10 |
                  (int)(float)(~-(uint)(fVar1 < 0.0) & (uint)fVar7) << 0x18);
}

Assistant:

static Colourb InterpolateColour(Colourb c0, Colourb c1, float alpha)
{
	Colourf c0f = ColourToLinearSpace(c0);
	Colourf c1f = ColourToLinearSpace(c1);
	Colourf c = Mix(c0f, c1f, alpha);
	return ColourFromLinearSpace(c);
}